

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

Error __thiscall asmjit::BaseCompiler::endFunc(BaseCompiler *this)

{
  FuncNode *pFVar1;
  Error EVar2;
  
  pFVar1 = this->_func;
  if (pFVar1 != (FuncNode *)0x0) {
    if (this->_localConstPool != (ConstPoolNode *)0x0) {
      BaseBuilder::setCursor
                (&this->super_BaseBuilder,(pFVar1->_end->super_BaseNode).field_0.field_0._prev);
      BaseBuilder::addNode(&this->super_BaseBuilder,(BaseNode *)this->_localConstPool);
      this->_localConstPool = (ConstPoolNode *)0x0;
    }
    this->_func = (FuncNode *)0x0;
    BaseBuilder::setCursor(&this->super_BaseBuilder,&pFVar1->_end->super_BaseNode);
    return 0;
  }
  EVar2 = BaseEmitter::reportError((BaseEmitter *)this,3,(char *)0x0);
  return EVar2;
}

Assistant:

Error BaseCompiler::endFunc() {
  FuncNode* func = _func;

  if (ASMJIT_UNLIKELY(!func))
    return reportError(DebugUtils::errored(kErrorInvalidState));

  // Add the local constant pool at the end of the function (if exists).
  if (_localConstPool) {
    setCursor(func->endNode()->prev());
    addNode(_localConstPool);
    _localConstPool = nullptr;
  }

  // Mark as finished.
  _func = nullptr;

  SentinelNode* end = func->endNode();
  setCursor(end);

  return kErrorOk;
}